

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O1

error uimm_extended(context *ctx,token *token,opcode *op)

{
  ulong *in_RCX;
  error *tmpres___LINE__;
  uint64_t value;
  ulong local_50;
  token local_48;
  
  convert_integer((token *)ctx,(int64_t)op,0,(uint64_t *)&Elf64_Ehdr_00100000);
  if (ctx->pc == 0) {
    ctx->pc = 0;
    if (0x7ffff < local_50) {
      local_50 = local_50 - 0x80000;
      if ((*in_RCX >> 0x38 & 1) != 0) goto LAB_001268de;
      *in_RCX = *in_RCX | 0x100000000000000;
    }
    if ((*in_RCX & local_50 << 0x14) != 0) {
LAB_001268de:
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    *in_RCX = *in_RCX | local_50 << 0x14;
    context::tokenize(&local_48,(context *)token);
    *(int *)&op[2].value = local_48.column;
    op[1].value = (uint64_t)local_48.data.string._M_str;
    op[1].reuse = local_48.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
    op->value = (uint64_t)local_48.filename;
    op->reuse = local_48.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
    ctx->pc = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(uimm_extended)
{
    uint64_t value;
    CHECK(convert_integer(token, 0, 1ULL << 20, &value));
    if (value >= 0x80000) {
        value -= 0x80000;
        op.add_bits(1ULL << 56);
    }
    op.add_bits(value << 20);
    token = ctx.tokenize();
    return {};
}